

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  undefined1 *this_00;
  PathArgument *arg;
  pointer pPVar4;
  bool bVar5;
  
  pPVar4 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = pPVar4 == (this->args_).
                    super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (undefined1 *)root;
  while (!bVar5) {
    bVar2 = true;
    if (pPVar4->kind_ == kindKey) {
      if (((Value *)this_00)->field_0x8 == '\a') {
        this_00 = (undefined1 *)Value::operator[]((Value *)this_00,(pPVar4->key_)._M_dataplus._M_p);
        if (this_00 == kNull) {
          Value::Value(__return_storage_ptr__,defaultValue);
          bVar2 = false;
          this_00 = kNull;
        }
      }
      else {
LAB_004bcc43:
        Value::Value(__return_storage_ptr__,defaultValue);
        bVar2 = false;
      }
    }
    else if (pPVar4->kind_ == kindIndex) {
      if ((((Value *)this_00)->field_0x8 != '\x06') ||
         (uVar1 = pPVar4->index_, AVar3 = Value::size((Value *)this_00), AVar3 <= uVar1))
      goto LAB_004bcc43;
      this_00 = (undefined1 *)Value::operator[]((Value *)this_00,pPVar4->index_);
    }
    if (!bVar2) break;
    pPVar4 = pPVar4 + 1;
    bVar5 = pPVar4 == (this->args_).
                      super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  }
  if (bVar5) {
    Value::Value(__return_storage_ptr__,(Value *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::null)
        return defaultValue;
    }
  }
  return *node;
}